

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> __thiscall
pbrt::Integrator::Create
          (Integrator *this,string *name,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          RGBColorSpace *colorSpace,FileLoc *loc)

{
  bool bVar1;
  _Head_base<0UL,_pbrt::Integrator_*,_false> _Var2;
  char *fmt;
  FileLoc *this_00;
  memory_resource *pmVar3;
  undefined1 local_218 [24];
  PrimitiveHandle local_200;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1f8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1e0;
  CameraHandle local_1c8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1c0;
  _Alloc_hider local_1a8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1a0;
  undefined1 local_198 [16];
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_188;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_180;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_168;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_150;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_138;
  FileLoc local_120;
  FileLoc local_108;
  FileLoc local_f0;
  FileLoc local_d8;
  FileLoc local_c0;
  FileLoc local_a8;
  FileLoc local_90;
  FileLoc local_78;
  FileLoc local_60;
  FileLoc local_48;
  
  this->_vptr_Integrator = (_func_int **)0x0;
  local_218._8_8_ = this;
  bVar1 = std::operator==(name,"path");
  if (bVar1) {
    local_138.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(camera->
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  ).bits;
    local_138.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(sampler->
                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
    local_138.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(aggregate->
                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                  ).bits;
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_60,lights);
    _Var2._M_head_impl = (Integrator *)local_218._8_8_;
    PathIntegrator::Create
              ((ParameterDictionary *)local_218,(CameraHandle *)parameters,
               (SamplerHandle *)
               &local_138.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (PrimitiveHandle *)
               &local_138.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish,&local_138,&local_60);
    this_00 = &local_60;
    pmVar3 = (memory_resource *)local_218._0_8_;
  }
  else {
    bVar1 = std::operator==(name,"simplepath");
    if (bVar1) {
      local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(camera->
                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    ).bits;
      local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(sampler->
                    super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                    ).bits;
      local_150.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(aggregate->
                    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                    ).bits;
      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_78,lights);
      _Var2._M_head_impl = (Integrator *)local_218._8_8_;
      SimplePathIntegrator::Create
                ((ParameterDictionary *)local_218,(CameraHandle *)parameters,
                 (SamplerHandle *)
                 &local_150.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (PrimitiveHandle *)
                 &local_150.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish,&local_150,&local_78);
      this_00 = &local_78;
      pmVar3 = (memory_resource *)local_218._0_8_;
    }
    else {
      bVar1 = std::operator==(name,"lightpath");
      if (bVar1) {
        local_168.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(camera->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits;
        local_168.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(sampler->
                      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
        local_168.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(aggregate->
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      ).bits;
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                  ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_90,lights
                  );
        _Var2._M_head_impl = (Integrator *)local_218._8_8_;
        LightPathIntegrator::Create
                  ((ParameterDictionary *)local_218,(CameraHandle *)parameters,
                   (SamplerHandle *)
                   &local_168.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (PrimitiveHandle *)
                   &local_168.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&local_168,&local_90);
        this_00 = &local_90;
        pmVar3 = (memory_resource *)local_218._0_8_;
      }
      else {
        bVar1 = std::operator==(name,"simplevolpath");
        if (bVar1) {
          local_180.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(camera->
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        ).bits;
          local_180.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)(sampler->
                        super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits;
          local_180.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)(aggregate->
                        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                        ).bits;
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_a8,
                     lights);
          _Var2._M_head_impl = (Integrator *)local_218._8_8_;
          SimpleVolPathIntegrator::Create
                    ((ParameterDictionary *)local_218,(CameraHandle *)parameters,
                     (SamplerHandle *)
                     &local_180.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (PrimitiveHandle *)
                     &local_180.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish,&local_180,&local_a8);
          this_00 = &local_a8;
          pmVar3 = (memory_resource *)local_218._0_8_;
        }
        else {
          bVar1 = std::operator==(name,"volpath");
          if (bVar1) {
            local_188.bits =
                 (camera->
                 super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                 ).bits;
            local_198._8_8_ =
                 (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            local_198._0_8_ =
                 (aggregate->
                 super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                 ).bits;
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                      ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_c0,
                       lights);
            _Var2._M_head_impl = (Integrator *)local_218._8_8_;
            VolPathIntegrator::Create
                      ((ParameterDictionary *)local_218,(CameraHandle *)parameters,
                       (SamplerHandle *)&local_188,(PrimitiveHandle *)(local_198 + 8),
                       (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_198,
                       &local_c0);
            this_00 = &local_c0;
            pmVar3 = (memory_resource *)local_218._0_8_;
          }
          else {
            bVar1 = std::operator==(name,"bdpt");
            if (bVar1) {
              local_1a0.bits =
                   (camera->
                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                   ).bits;
              local_1a8._M_p =
                   (pointer)(sampler->
                            super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
              local_1c0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(aggregate->
                            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                            ).bits;
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                        ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_d8,
                         lights);
              _Var2._M_head_impl = (Integrator *)local_218._8_8_;
              BDPTIntegrator::Create
                        ((BDPTIntegrator *)local_218,parameters,(CameraHandle *)&local_1a0,
                         (SamplerHandle *)&local_1a8,
                         (PrimitiveHandle *)
                         &local_1c0.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_d8,
                         loc);
              this_00 = &local_d8;
              pmVar3 = (memory_resource *)local_218._0_8_;
            }
            else {
              bVar1 = std::operator==(name,"mlt");
              if (bVar1) {
                local_1c0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(camera->
                              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                              ).bits;
                local_1c0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(aggregate->
                              super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                              ).bits;
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                          ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           &local_f0,lights);
                _Var2._M_head_impl = (Integrator *)local_218._8_8_;
                MLTIntegrator::Create
                          ((ParameterDictionary *)local_218,(CameraHandle *)parameters,
                           (PrimitiveHandle *)
                           &local_1c0.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_1c0,&local_f0);
                this_00 = &local_f0;
                pmVar3 = (memory_resource *)local_218._0_8_;
              }
              else {
                bVar1 = std::operator==(name,"ambientocclusion");
                if (bVar1) {
                  local_1c8.
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                           )((ulong)&colorSpace->illuminant | 0x2000000000000);
                  local_1e0.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)(camera->
                                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                ).bits;
                  local_1e0.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       (pointer)(sampler->
                                super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                ).bits;
                  local_1e0.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)(aggregate->
                                super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                ).bits;
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             &local_48,lights);
                  _Var2._M_head_impl = (Integrator *)local_218._8_8_;
                  AOIntegrator::Create
                            ((ParameterDictionary *)local_218,(SpectrumHandle *)parameters,
                             &local_1c8,
                             (SamplerHandle *)
                             &local_1e0.
                              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (PrimitiveHandle *)
                             &local_1e0.
                              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_1e0,&local_48);
                  this_00 = &local_48;
                  pmVar3 = (memory_resource *)local_218._0_8_;
                }
                else {
                  bVar1 = std::operator==(name,"randomwalk");
                  if (bVar1) {
                    local_1f8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(camera->
                                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                  ).bits;
                    local_1f8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(sampler->
                                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                  ).bits;
                    local_1f8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)(aggregate->
                                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                  ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               &local_108,lights);
                    _Var2._M_head_impl = (Integrator *)local_218._8_8_;
                    RandomWalkIntegrator::Create
                              ((ParameterDictionary *)local_218,(CameraHandle *)parameters,
                               (SamplerHandle *)
                               &local_1f8.
                                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (PrimitiveHandle *)
                               &local_1f8.
                                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_1f8,&local_108);
                    this_00 = &local_108;
                    pmVar3 = (memory_resource *)local_218._0_8_;
                  }
                  else {
                    bVar1 = std::operator==(name,"sppm");
                    if (!bVar1) {
                      fmt = "%s: integrator type unknown.";
                      goto LAB_00440a30;
                    }
                    local_200.
                    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                    .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                             )(camera->
                              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                              ).bits;
                    local_218._16_8_ =
                         (aggregate->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               &local_120,lights);
                    _Var2._M_head_impl = (Integrator *)local_218._8_8_;
                    SPPMIntegrator::Create
                              ((ParameterDictionary *)local_218,(RGBColorSpace *)parameters,
                               (CameraHandle *)colorSpace,&local_200,
                               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               (local_218 + 0x10),&local_120);
                    this_00 = &local_120;
                    pmVar3 = (memory_resource *)local_218._0_8_;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_218._0_8_ = (memory_resource *)0x0;
  (_Var2._M_head_impl)->_vptr_Integrator = (_func_int **)pmVar3;
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
            ((_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)this_00);
  if (pmVar3 != (memory_resource *)0x0) {
    ParameterDictionary::ReportUnused(parameters);
    return (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           (tuple<pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>)_Var2._M_head_impl;
  }
  fmt = "%s: unable to create integrator.";
LAB_00440a30:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

std::unique_ptr<Integrator> Integrator::Create(
    const std::string &name, const ParameterDictionary &parameters, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const RGBColorSpace *colorSpace, const FileLoc *loc) {
    std::unique_ptr<Integrator> integrator;
    if (name == "path")
        integrator =
            PathIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "simplepath")
        integrator = SimplePathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "lightpath")
        integrator = LightPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                 lights, loc);
    else if (name == "simplevolpath")
        integrator = SimpleVolPathIntegrator::Create(parameters, camera, sampler,
                                                     aggregate, lights, loc);
    else if (name == "volpath")
        integrator = VolPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                               lights, loc);
    else if (name == "bdpt")
        integrator =
            BDPTIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "mlt")
        integrator = MLTIntegrator::Create(parameters, camera, aggregate, lights, loc);
    else if (name == "ambientocclusion")
        integrator = AOIntegrator::Create(parameters, &colorSpace->illuminant, camera,
                                          sampler, aggregate, lights, loc);
    else if (name == "randomwalk")
        integrator = RandomWalkIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "sppm")
        integrator = SPPMIntegrator::Create(parameters, colorSpace, camera, aggregate,
                                            lights, loc);
    else
        ErrorExit(loc, "%s: integrator type unknown.", name);

    if (!integrator)
        ErrorExit(loc, "%s: unable to create integrator.", name);

    parameters.ReportUnused();
    return integrator;
}